

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_status.cpp
# Opt level: O0

void __thiscall libtorrent::torrent_status::torrent_status(torrent_status *this)

{
  int local_1c;
  duration<long,_std::ratio<1L,_1L>_> local_18;
  torrent_status *local_10;
  torrent_status *this_local;
  
  local_10 = this;
  torrent_handle::torrent_handle(&this->handle);
  boost::system::error_code::error_code(&this->errc);
  (this->error_file).m_val = -1;
  ::std::__cxx11::string::string((string *)&this->save_path);
  ::std::__cxx11::string::string((string *)&this->name);
  ::std::weak_ptr<const_libtorrent::torrent_info>::weak_ptr(&this->torrent_file);
  local_1c = 0;
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_18,&local_1c);
  ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&this->next_announce,&local_18);
  ::std::__cxx11::string::string((string *)&this->current_tracker);
  this->total_download = 0;
  this->total_upload = 0;
  this->total_payload_download = 0;
  this->total_payload_upload = 0;
  this->total_failed_bytes = 0;
  this->total_redundant_bytes = 0;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  typed_bitfield(&this->pieces);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  typed_bitfield(&this->verified_pieces);
  this->total_done = 0;
  this->total = 0;
  this->total_wanted_done = 0;
  this->total_wanted = 0;
  this->all_time_upload = 0;
  this->all_time_download = 0;
  this->added_time = 0;
  this->completed_time = 0;
  this->last_seen_complete = 0;
  this->storage_mode = storage_mode_sparse;
  this->progress = 0.0;
  this->progress_ppm = 0;
  (this->queue_position).m_val = 0;
  this->download_rate = 0;
  this->upload_rate = 0;
  this->download_payload_rate = 0;
  this->upload_payload_rate = 0;
  this->num_seeds = 0;
  this->num_peers = 0;
  this->num_complete = -1;
  this->num_incomplete = -1;
  this->list_seeds = 0;
  this->list_peers = 0;
  this->connect_candidates = 0;
  this->num_pieces = 0;
  this->distributed_full_copies = 0;
  this->distributed_fraction = 0;
  this->distributed_copies = 0.0;
  this->block_size = 0;
  this->num_uploads = 0;
  this->num_connections = 0;
  this->uploads_limit = 0;
  this->connections_limit = 0;
  this->up_bandwidth_queue = 0;
  this->down_bandwidth_queue = 0;
  this->seed_rank = 0;
  this->state = checking_resume_data;
  this->need_save_resume = false;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>::
  bitfield_flag(&this->need_save_resume_data);
  this->is_seeding = false;
  this->is_finished = false;
  this->has_metadata = false;
  this->has_incoming = false;
  this->moving_storage = false;
  this->announcing_to_trackers = false;
  this->announcing_to_lsd = false;
  this->announcing_to_dht = false;
  digest32<160L>::digest32(&this->info_hash);
  info_hash_t::info_hash_t(&this->info_hashes);
  ::std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->last_upload);
  ::std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->last_download);
  libtorrent::flags::bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>::
  bitfield_flag(&this->flags);
  return;
}

Assistant:

torrent_status::torrent_status() noexcept {}